

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peimage.cpp
# Opt level: O2

CBString * machineTypeToUString(CBString *__return_storage_ptr__,UINT16 machineType)

{
  int iVar1;
  undefined6 in_register_00000032;
  char *s;
  
  iVar1 = (int)CONCAT62(in_register_00000032,machineType);
  switch(iVar1) {
  case 0x1c0:
    s = "ARM";
    break;
  case 0x1c1:
  case 0x1c3:
  case 0x1c5:
switchD_0013e171_caseD_1c1:
    usprintf(__return_storage_ptr__,"Unknown %04Xh",machineType);
    return __return_storage_ptr__;
  case 0x1c2:
    s = "ARM Thumb";
    break;
  case 0x1c4:
    s = "ARMv7";
    break;
  case 0x1c6:
    s = "Apple ARM";
    break;
  default:
    if (iVar1 == 0x14c) {
      s = "x86";
    }
    else if (iVar1 == 0x1f0) {
      s = "PowerPC";
    }
    else if (iVar1 == 0x1f1) {
      s = "PowerPC FP";
    }
    else if (iVar1 == 0x200) {
      s = "IA64";
    }
    else if (iVar1 == 0xebc) {
      s = "EBC";
    }
    else if (iVar1 == 0x5032) {
      s = "RISC-V 32-bit";
    }
    else if (iVar1 == 0x5064) {
      s = "RISC-V 64-bit";
    }
    else if (iVar1 == 0x5128) {
      s = "RISC-V 128-bit";
    }
    else if (iVar1 == 0xaa64) {
      s = "AArch64";
    }
    else {
      if (iVar1 != 0x8664) goto switchD_0013e171_caseD_1c1;
      s = "x86-64";
    }
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString machineTypeToUString(UINT16 machineType)
{
    switch (machineType) {
        case EFI_IMAGE_FILE_MACHINE_AMD64:       return UString("x86-64");
        case EFI_IMAGE_FILE_MACHINE_ARM:         return UString("ARM");
        case EFI_IMAGE_FILE_MACHINE_ARMNT:       return UString("ARMv7");
        case EFI_IMAGE_FILE_MACHINE_APPLE_ARM:   return UString("Apple ARM");
        case EFI_IMAGE_FILE_MACHINE_AARCH64:     return UString("AArch64");
        case EFI_IMAGE_FILE_MACHINE_EBC:         return UString("EBC");
        case EFI_IMAGE_FILE_MACHINE_I386:        return UString("x86");
        case EFI_IMAGE_FILE_MACHINE_IA64:        return UString("IA64");
        case EFI_IMAGE_FILE_MACHINE_POWERPC:     return UString("PowerPC");
        case EFI_IMAGE_FILE_MACHINE_POWERPCFP:   return UString("PowerPC FP");
        case EFI_IMAGE_FILE_MACHINE_THUMB:       return UString("ARM Thumb");
        case EFI_IMAGE_FILE_MACHINE_RISCV32:     return UString("RISC-V 32-bit");
        case EFI_IMAGE_FILE_MACHINE_RISCV64:     return UString("RISC-V 64-bit");
        case EFI_IMAGE_FILE_MACHINE_RISCV128:    return UString("RISC-V 128-bit");
    }
    return usprintf("Unknown %04Xh", machineType);
}